

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O0

pchar * p_strdup(pchar *str)

{
  size_t sVar1;
  psize len;
  pchar *ret;
  pchar *str_local;
  
  if (str == (pchar *)0x0) {
    str_local = (pchar *)0x0;
  }
  else {
    sVar1 = strlen(str);
    str_local = (pchar *)p_malloc(sVar1 + 1);
    if (str_local == (pchar *)0x0) {
      str_local = (pchar *)0x0;
    }
    else {
      memcpy(str_local,str,sVar1 + 1);
    }
  }
  return str_local;
}

Assistant:

P_LIB_API pchar *
p_strdup (const pchar *str)
{
	pchar	*ret;
	psize	len;

	if (P_UNLIKELY (str == NULL))
		return NULL;

	len = strlen (str) + 1;

	if (P_UNLIKELY ((ret = p_malloc (len)) == NULL))
		return NULL;

	memcpy (ret, str, len);

	return ret;
}